

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# winingstate_test.cpp
# Opt level: O0

void __thiscall
TEST_WiningStateTest_DoubleReady_TestShell::TEST_WiningStateTest_DoubleReady_TestShell
          (TEST_WiningStateTest_DoubleReady_TestShell *this)

{
  TEST_WiningStateTest_DoubleReady_TestShell *this_local;
  
  UtestShell::UtestShell(&this->super_UtestShell);
  (this->super_UtestShell)._vptr_UtestShell =
       (_func_int **)&PTR__TEST_WiningStateTest_DoubleReady_TestShell_0025c590;
  return;
}

Assistant:

TEST(WiningStateTest, DoubleReady)
{
	addNoWiningHand();

	h.doubleReady();
	winByDiscard();
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::DoubleReady));
	CHECK_EQUAL(2, r.doubling_factor);
}